

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void mean_int_2_suite::test_three(void)

{
  value_type_conflict1 local_60;
  undefined4 local_5c;
  moment<int,_2> filter;
  
  filter.member.window.super_span<int,_2UL>.member.size = 0;
  filter.member.window.super_span<int,_2UL>.member.next = 2;
  filter.member.mean = 0;
  filter.member.window.super_span<int,_2UL>.member.data = (pointer)&filter;
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push(&filter,1);
  local_60 = filter.member.mean;
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1bb,"void mean_int_2_suite::test_three()",&local_60,&local_5c);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push(&filter,3);
  local_60 = filter.member.mean;
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1bd,"void mean_int_2_suite::test_three()",&local_60,&local_5c);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push(&filter,0);
  local_60 = filter.member.mean;
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1bf,"void mean_int_2_suite::test_three()",&local_60,&local_5c);
  return;
}

Assistant:

void test_three()
{
    window::moment<int, 2> filter;
    filter.push(1);
    TRIAL_TEST_EQ(filter.mean(), 1);
    filter.push(3);
    TRIAL_TEST_EQ(filter.mean(), 2);
    filter.push(0);
    TRIAL_TEST_EQ(filter.mean(), 2); // Rounded up
}